

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O0

int g2d_line_intersect_line(g2d_line_t *linea,g2d_line_t *lineb,double *p)

{
  double dVar1;
  double x00;
  double det;
  double b10;
  double b00;
  double i01;
  double i00;
  double m11;
  double m10;
  double m01;
  double m00;
  double *p_local;
  g2d_line_t *lineb_local;
  g2d_line_t *linea_local;
  
  dVar1 = linea->u[0] * -lineb->u[1] + -(-lineb->u[0] * linea->u[1]);
  if (1e-08 <= ABS(dVar1)) {
    dVar1 = (-lineb->u[1] / dVar1) * (lineb->p[0] - linea->p[0]) +
            (--lineb->u[0] / dVar1) * (lineb->p[1] - linea->p[1]);
    if (p != (double *)0x0) {
      *p = linea->u[0] * dVar1 + linea->p[0];
      p[1] = linea->u[1] * dVar1 + linea->p[1];
    }
    linea_local._4_4_ = 1;
  }
  else {
    linea_local._4_4_ = 0;
  }
  return linea_local._4_4_;
}

Assistant:

int g2d_line_intersect_line(const g2d_line_t *linea, const g2d_line_t *lineb, double *p)
{
    // this implementation is many times faster than the original,
    // mostly due to avoiding a general-purpose LU decomposition in
    // Matrix.inverse().
    double m00, m01, m10, m11;
    double i00, i01;
    double b00, b10;

    m00 = linea->u[0];
    m01= -lineb->u[0];
    m10 = linea->u[1];
    m11= -lineb->u[1];

    // determinant of m
    double det = m00*m11-m01*m10;

    // parallel lines?
    if (fabs(det) < 0.00000001)
        return 0;

    // inverse of m
    i00 = m11/det;
    i01 = -m01/det;

    b00 = lineb->p[0] - linea->p[0];
    b10 = lineb->p[1] - linea->p[1];

    double x00; //, x10;
    x00 = i00*b00+i01*b10;

    if (p != NULL) {
        p[0] = linea->u[0]*x00 + linea->p[0];
        p[1] = linea->u[1]*x00 + linea->p[1];
    }

    return 1;
}